

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::keyReleaseEvent(QAbstractButton *this,QKeyEvent *e)

{
  long lVar1;
  int *piVar2;
  QAbstractButtonPrivate *this_00;
  long lVar3;
  long in_FS_OFFSET;
  QList<Qt::Key> local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  if (-1 < *(short *)(e + 0x50)) {
    QBasicTimer::stop();
  }
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d._0_4_ = 0xaaaaaaaa;
  local_68.d.d._4_4_ = 0xaaaaaaaa;
  local_68.d.ptr._0_4_ = 0xaaaaaaaa;
  local_68.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
            (&local_48,QGuiApplicationPrivate::platform_theme,0x28);
  qvariant_cast<QList<Qt::Key>>(&local_68,&local_48);
  ::QVariant::~QVariant(&local_48);
  if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
    lVar3 = 0;
    do {
      if (local_68.d.size << 2 == lVar3) goto LAB_003bf0ad;
      lVar1 = lVar3 + 4;
      piVar2 = (int *)(CONCAT44(local_68.d.ptr._4_4_,local_68.d.ptr._0_4_) + lVar3);
      lVar3 = lVar1;
    } while (*piVar2 != *(int *)(e + 0x40));
    if (((lVar1 != 0) && (-1 < *(short *)(e + 0x50))) && ((this_00->field_0x28c & 0x10) != 0)) {
      QAbstractButtonPrivate::click(this_00);
      goto LAB_003bf0b1;
    }
  }
LAB_003bf0ad:
  e[0xc] = (QKeyEvent)0x0;
LAB_003bf0b1:
  piVar2 = (int *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_),4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QAbstractButton);

    if (!e->isAutoRepeat())
        d->repeatTimer.stop();

    const auto buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                         ->themeHint(QPlatformTheme::ButtonPressKeys)
                                         .value<QList<Qt::Key>>();
    if (buttonPressKeys.contains(e->key()) && !e->isAutoRepeat() && d->down) {
        d->click();
        return;
    }

    e->ignore();
}